

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

AssertionExpr *
slang::ast::bindAssertionBody
          (Symbol *symbol,SyntaxNode *syntax,ASTContext *context,SourceLocation outputLocalVarArgLoc
          ,AssertionInstanceDetails *instance,SmallVectorBase<const_slang::ast::Symbol_*> *localVars
          )

{
  string_view arg;
  bool bVar1;
  int iVar2;
  SequenceExprSyntax *pSVar3;
  undefined4 extraout_var;
  PropertySpecSyntax *pPVar4;
  undefined4 extraout_var_00;
  socklen_t __len;
  Diagnostic *in_RDX;
  SyntaxNode *in_RSI;
  int *in_RDI;
  SourceRange SVar5;
  PropertyDeclarationSyntax *pds;
  Diagnostic *diag;
  AssertionExpr *result;
  SequenceDeclarationSyntax *sds;
  anon_class_32_4_3d8173ec createLocals;
  ASTContext *in_stack_ffffffffffffff08;
  AssertionExpr *in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff24;
  DiagCode noteCode;
  ASTContext *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  DiagCode code;
  SourceLocation this;
  SourceLocation SVar6;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar7;
  bitmask<slang::ast::NondegeneracyStatus> local_8c;
  undefined1 local_88 [32];
  AssertionExpr *local_68;
  SequenceDeclarationSyntax *local_60;
  Diagnostic *local_28;
  AssertionExpr *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0);
  local_28 = in_RDX;
  if (*in_RDI == 0x4f) {
    local_60 = slang::syntax::SyntaxNode::as<slang::syntax::SequenceDeclarationSyntax>(in_RSI);
    bindAssertionBody(slang::ast::Symbol_const&,slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SourceLocation,slang::ast::AssertionInstanceDetails&,slang::SmallVectorBase<slang::ast::Symbol_const*>&)
    ::$_0::operator()((anon_class_32_4_3d8173ec *)sds,(SequenceDeclarationSyntax *)result);
    pSVar3 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                       ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xbb51b6);
    iVar2 = AssertionExpr::bind((int)pSVar3,(sockaddr *)local_28,0);
    local_68 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
    AssertionExpr::requireSequence(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xbb51f2);
    noteCode = (DiagCode)(in_stack_ffffffffffffff24 & 0xffffff);
    if (bVar1) {
      AssertionExpr::checkNondegeneracy(in_stack_ffffffffffffff10);
      in_stack_ffffffffffffff18 = (SourceLocation)local_88;
      bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_8c,AdmitsEmpty);
      bVar1 = bitmask<slang::ast::NondegeneracyStatus>::has
                        ((bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff10,
                         (bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff08);
      noteCode.code._1_1_ = bVar1;
    }
    if (noteCode.code._1_1_ != '\0') {
      uVar7 = 0x6c0007;
      not_null<slang::syntax::SequenceExprSyntax_*>::operator->
                ((not_null<slang::syntax::SequenceExprSyntax_*> *)0xbb5277);
      SVar5 = slang::syntax::SyntaxNode::sourceRange
                        ((SyntaxNode *)CONCAT44(uVar7,in_stack_ffffffffffffff60));
      this = SVar5.startLoc;
      SVar6 = SVar5.endLoc;
      SVar5.endLoc._0_4_ = in_stack_ffffffffffffff38;
      SVar5.startLoc = (SourceLocation)in_stack_ffffffffffffff30;
      SVar5.endLoc._4_4_ = in_stack_ffffffffffffff3c;
      ASTContext::addDiag(in_stack_ffffffffffffff28,code,SVar5);
      arg._M_str._0_4_ = in_stack_ffffffffffffff60;
      arg._M_len = (size_t)SVar6;
      arg._M_str._4_4_ = uVar7;
      Diagnostic::operator<<((Diagnostic *)this,arg);
      Diagnostic::addNote(local_28,noteCode,in_stack_ffffffffffffff18);
    }
    local_8 = local_68;
  }
  else {
    slang::syntax::SyntaxNode::as<slang::syntax::PropertyDeclarationSyntax>(in_RSI);
    bindAssertionBody(slang::ast::Symbol_const&,slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SourceLocation,slang::ast::AssertionInstanceDetails&,slang::SmallVectorBase<slang::ast::Symbol_const*>&)
    ::$_0::operator()((anon_class_32_4_3d8173ec *)sds,(PropertyDeclarationSyntax *)result);
    pPVar4 = not_null<slang::syntax::PropertySpecSyntax_*>::operator*
                       ((not_null<slang::syntax::PropertySpecSyntax_*> *)0xbb5345);
    iVar2 = AssertionExpr::bind((int)pPVar4,(sockaddr *)local_28,__len);
    local_8 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar2);
  }
  return local_8;
}

Assistant:

static const AssertionExpr& bindAssertionBody(const Symbol& symbol, const SyntaxNode& syntax,
                                              const ASTContext& context,
                                              SourceLocation outputLocalVarArgLoc,
                                              AssertionInstanceDetails& instance,
                                              SmallVectorBase<const Symbol*>& localVars) {
    auto createLocals = [&](auto& syntaxType) {
        auto& scope = symbol.as<Scope>();
        for (auto varSyntax : syntaxType.variables) {
            SmallVector<const LocalAssertionVarSymbol*> vars;
            LocalAssertionVarSymbol::fromSyntax(*context.scope, *varSyntax, vars);
            for (auto var : vars) {
                var->getDeclaredType()->forceResolveAt(context);
                if (!var->name.empty()) {
                    auto [it, inserted] = instance.localVars.emplace(var->name, var);
                    if (inserted) {
                        localVars.push_back(var);

                        // If value successfully inserted then check LRM 16.10 section restriction:
                        // "It's illegal to declare a local variable if it is a formal argument of
                        // a sequence declaration."
                        if (auto other = scope.find(var->name))
                            context.scope->reportNameConflict(*var, *other);
                    }
                    else {
                        context.scope->reportNameConflict(*var, *it->second);
                    }
                }
            }
        }
    };

    if (symbol.kind == SymbolKind::Sequence) {
        auto& sds = syntax.as<SequenceDeclarationSyntax>();
        createLocals(sds);

        auto& result = AssertionExpr::bind(*sds.seqExpr, context);
        result.requireSequence(context);

        if (outputLocalVarArgLoc &&
            result.checkNondegeneracy().status.has(NondegeneracyStatus::AdmitsEmpty)) {
            auto& diag = context.addDiag(diag::LocalVarOutputEmptyMatch,
                                         sds.seqExpr->sourceRange());
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, outputLocalVarArgLoc);
        }

        return result;
    }
    else {
        auto& pds = syntax.as<PropertyDeclarationSyntax>();
        createLocals(pds);
        return AssertionExpr::bind(*pds.propertySpec, context);
    }
}